

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int ScaKwdTab(GmfMshSct *msh)

{
  int iVar1;
  ushort **ppuVar2;
  long in_RDI;
  char str [1024];
  int64_t LstPos;
  int64_t EndPos;
  int64_t NexPos;
  int c;
  int KwdCod;
  undefined4 in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  undefined6 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd6;
  undefined1 in_stack_fffffffffffffbd7;
  char local_428 [1024];
  int64_t local_28;
  int64_t local_20;
  int64_t local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = in_RDI;
  if ((*(uint *)(in_RDI + 0xc) & 1) == 0) {
    local_20 = GetFilSiz((GmfMshSct *)
                         CONCAT17(in_stack_fffffffffffffbd7,
                                  CONCAT16(in_stack_fffffffffffffbd6,in_stack_fffffffffffffbd0)));
    local_28 = -1;
    do {
      ScaWrd((GmfMshSct *)
             CONCAT17(in_stack_fffffffffffffbd7,
                      CONCAT16(in_stack_fffffffffffffbd6,in_stack_fffffffffffffbd0)),
             (void *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      local_18 = GetPos((GmfMshSct *)
                        CONCAT17(in_stack_fffffffffffffbd7,
                                 CONCAT16(in_stack_fffffffffffffbd6,in_stack_fffffffffffffbd0)));
      if (local_20 < local_18) {
        longjmp((__jmp_buf_tag *)(local_8 + 0x48),-0x18);
      }
      if ((local_18 != 0) && (local_18 <= local_28)) {
        longjmp((__jmp_buf_tag *)(local_8 + 0x48),-0x1e);
      }
      local_28 = local_18;
      if ((0 < local_c) && (local_c < 0xf1)) {
        ScaKwdHdr((GmfMshSct *)
                  CONCAT17(in_stack_fffffffffffffbd7,
                           CONCAT16(in_stack_fffffffffffffbd6,in_stack_fffffffffffffbd0)),
                  in_stack_fffffffffffffbcc);
      }
      if ((local_18 != 0) &&
         (iVar1 = SetFilPos((GmfMshSct *)
                            CONCAT17(in_stack_fffffffffffffbd7,
                                     CONCAT16(in_stack_fffffffffffffbd6,in_stack_fffffffffffffbd0)),
                            CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)),
         iVar1 == 0)) {
        longjmp((__jmp_buf_tag *)(local_8 + 0x48),-0x19);
      }
      in_stack_fffffffffffffbd6 = local_18 != 0 && local_c != 0x36;
    } while ((bool)in_stack_fffffffffffffbd6);
  }
  else {
LAB_00107c08:
    iVar1 = __isoc99_fscanf(*(undefined8 *)(local_8 + 0x300410),"%100s",local_428);
    if (iVar1 != -1) {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)local_428[0]] & 0x400) == 0) {
        if (local_428[0] == '#') {
          do {
            local_10 = fgetc(*(FILE **)(local_8 + 0x300410));
            in_stack_fffffffffffffbd7 = local_10 != 10 && local_10 != -1;
          } while (local_10 != 10 && local_10 != -1);
        }
      }
      else {
        for (local_c = 1; local_c < 0xf1; local_c = local_c + 1) {
          iVar1 = strcmp(local_428,GmfKwdFmt[local_c][0]);
          if (iVar1 == 0) {
            ScaKwdHdr((GmfMshSct *)
                      CONCAT17(in_stack_fffffffffffffbd7,
                               CONCAT16(in_stack_fffffffffffffbd6,in_stack_fffffffffffffbd0)),
                      in_stack_fffffffffffffbcc);
            break;
          }
        }
      }
      goto LAB_00107c08;
    }
  }
  return 1;
}

Assistant:

static int ScaKwdTab(GmfMshSct *msh)
{
   int      KwdCod, c;
   int64_t  NexPos, EndPos, LstPos;
   char     str[ GmfStrSiz ];

   if(msh->typ & Asc)
   {
      // Scan each string in the file until the end
      while(fscanf(msh->hdl, "%100s", str) != EOF)
      {
         // Fast test in order to reject quickly the numeric values
         if(isalpha(str[0]))
         {
            // Search which kwd code this string is associated with, then get its
            // header and save the curent position in file (just before the data)
            for(KwdCod=1; KwdCod<= GmfMaxKwd; KwdCod++)
               if(!strcmp(str, GmfKwdFmt[ KwdCod ][0]))
               {
                  ScaKwdHdr(msh, KwdCod);
                  break;
               }
         }
         else if(str[0] == '#')
            while((c = fgetc(msh->hdl)) != '\n' && c != EOF);
      }
   }
   else
   {
      // Get file size
      EndPos = GetFilSiz(msh);
      LstPos = -1;

      // Jump through kwd positions in the file
      do
      {
         // Get the kwd code and the next kwd position
         ScaWrd(msh, ( char *)&KwdCod);
         NexPos = GetPos(msh);

         // Make sure the flow does not move beyond the file size
         if(NexPos > EndPos)
            longjmp(msh->err, -24);

         // And check that it does not move back
         if(NexPos && (NexPos <= LstPos))
            longjmp(msh->err, -30);

         LstPos = NexPos;

         // Check if this kwd belongs to this mesh version
         if( (KwdCod >= 1) && (KwdCod <= GmfMaxKwd) )
            ScaKwdHdr(msh, KwdCod);

         // Go to the next kwd
         if(NexPos && !(SetFilPos(msh, NexPos)))
            longjmp(msh->err, -25);

      }while(NexPos && (KwdCod != GmfEnd));
   }

   return(1);
}